

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ActivationParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_activation(NeuralNetworkLayer *this)

{
  bool bVar1;
  ActivationParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_activation(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_activation(this);
    this_00 = (ActivationParams *)operator_new(0x20);
    ActivationParams::ActivationParams(this_00);
    (this->layer_).activation_ = this_00;
  }
  return (ActivationParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ActivationParams* NeuralNetworkLayer::mutable_activation() {
  if (!has_activation()) {
    clear_layer();
    set_has_activation();
    layer_.activation_ = new ::CoreML::Specification::ActivationParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.activation)
  return layer_.activation_;
}